

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O3

Vec_Int_t * Gia_ManFindPivots(Gia_Man_t *p,int SelectShift,int fOnlyCis,int fVerbose)

{
  int iVar1;
  uint nSize;
  undefined1 auVar2 [16];
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *p_01;
  int *piVar5;
  Vec_Int_t *p_02;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  Gia_ManCreateRefs(p);
  piVar5 = p->pRefs;
  iVar8 = p->nObjs;
  p->pRefs = (int *)0x0;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_01->pArray = piVar4;
  if ((long)iVar8 < 1) {
    if (piVar5 != (int *)0x0) goto LAB_0071ecd5;
  }
  else {
    lVar10 = 0;
    do {
      iVar1 = piVar5[lVar10];
      if (1 < iVar1) {
        if (fOnlyCis != 0) {
          if (p->nObjs <= lVar10) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(p->pObjs + lVar10) & 0x9fffffff) != 0) goto LAB_0071ecc1;
        }
        Vec_IntPush(p_00,(int)lVar10);
        Vec_IntPush(p_01,iVar1);
      }
LAB_0071ecc1:
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar8);
LAB_0071ecd5:
    free(piVar5);
  }
  if (fVerbose != 0) {
    iVar8 = p->vCis->nSize;
    printf("Selected %d pivots with more than one fanout (out of %d CIs and ANDs).\n",
           (ulong)(uint)p_01->nSize,(ulong)(uint)(iVar8 + p->nObjs + ~(p->vCos->nSize + iVar8)));
  }
  Gia_ManRandom(1);
  Gia_ManRandom(0);
  nSize = p_01->nSize;
  lVar10 = (long)(int)nSize;
  if (0 < lVar10) {
    lVar9 = 0;
    do {
      uVar3 = Gia_ManRandom(0);
      uVar7 = (ulong)(uVar3 >> 1) % (ulong)nSize;
      piVar5 = p_00->pArray;
      iVar8 = piVar5[lVar9];
      piVar5[lVar9] = piVar5[uVar7];
      piVar5[uVar7] = iVar8;
      piVar5 = p_01->pArray;
      iVar8 = piVar5[lVar9];
      piVar5[lVar9] = piVar5[uVar7];
      piVar5[uVar7] = iVar8;
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  if (SelectShift == 0) {
    piVar5 = Abc_QuickSortCost(p_01->pArray,nSize,1);
  }
  else {
    uVar3 = 0x10;
    if (0xe < nSize - 1) {
      uVar3 = nSize;
    }
    if (uVar3 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)(int)uVar3 << 2);
    }
    auVar2 = _DAT_0094e250;
    if (0 < (int)nSize) {
      lVar10 = lVar10 + -1;
      auVar11._8_4_ = (int)lVar10;
      auVar11._0_8_ = lVar10;
      auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar7 = 0;
      auVar11 = auVar11 ^ _DAT_0094e250;
      auVar12 = _DAT_0094e240;
      do {
        auVar13 = auVar12 ^ auVar2;
        if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                    auVar11._4_4_ < auVar13._4_4_) & 1)) {
          piVar5[uVar7] = (int)uVar7;
        }
        if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
            auVar13._12_4_ <= auVar11._12_4_) {
          piVar5[uVar7 + 1] = (int)uVar7 + 1;
        }
        uVar7 = uVar7 + 2;
        lVar10 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar10 + 2;
      } while ((nSize + 1 & 0xfffffffe) != uVar7);
    }
  }
  uVar3 = 0x40;
  if ((int)nSize < 0x40) {
    uVar3 = nSize;
  }
  p_02 = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar3 - 1) {
    uVar6 = uVar3;
  }
  p_02->nSize = 0;
  p_02->nCap = uVar6;
  if (uVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)(int)uVar6 << 2);
  }
  p_02->pArray = piVar4;
  if ((int)nSize < 1) {
    piVar4 = p_00->pArray;
    if (piVar4 == (int *)0x0) goto LAB_0071ef34;
  }
  else {
    do {
      iVar8 = (int)((long)SelectShift % (long)(int)nSize);
      if (fVerbose != 0) {
        iVar1 = piVar5[iVar8];
        lVar10 = (long)iVar1;
        if (((lVar10 < 0) || (p_00->nSize <= iVar1)) || ((int)nSize <= iVar1)) goto LAB_0071ef78;
        printf("%2d : Pivot =%7d  Fanout =%7d\n",(long)SelectShift % (long)(int)nSize & 0xffffffff,
               (ulong)(uint)p_00->pArray[lVar10],(ulong)(uint)p_01->pArray[lVar10]);
      }
      iVar8 = piVar5[iVar8];
      if (((long)iVar8 < 0) || (p_00->nSize <= iVar8)) {
LAB_0071ef78:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = p_00->pArray;
      Vec_IntPush(p_02,piVar4[iVar8]);
      SelectShift = SelectShift + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  free(piVar4);
LAB_0071ef34:
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  return p_02;
}

Assistant:

Vec_Int_t * Gia_ManFindPivots( Gia_Man_t * p, int SelectShift, int fOnlyCis, int fVerbose )
{
    Vec_Int_t * vPivots, * vWeights;
    Vec_Int_t * vCount, * vResult;
    int i, j, Count, * pPerm, Limit;
/*
    Gia_Obj_t * pObj;
    // count MUX controls
    vCount = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_Obj_t * pNodeC, * pNodeT, * pNodeE;
        if ( !Gia_ObjIsMuxType(pObj) ) 
            continue;
        pNodeC = Gia_ObjRecognizeMux( pObj, &pNodeT, &pNodeE );
        Vec_IntAddToEntry( vCount, Gia_ObjId(p, Gia_Regular(pNodeC)), 1 );
    }
*/
    // count references
    Gia_ManCreateRefs( p );
    vCount = Vec_IntAllocArray( p->pRefs, Gia_ManObjNum(p) ); p->pRefs = NULL;

    // collect nodes 
    vPivots  = Vec_IntAlloc( 100 );
    vWeights = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vCount, Count, i )
    {
        if ( Count < 2 ) continue;
        if ( fOnlyCis && !Gia_ObjIsCi(Gia_ManObj(p, i)) )
            continue;
        Vec_IntPush( vPivots, i );
        Vec_IntPush( vWeights, Count );
    }
    Vec_IntFree( vCount );

    if ( fVerbose )
        printf( "Selected %d pivots with more than one fanout (out of %d CIs and ANDs).\n", Vec_IntSize(vWeights), Gia_ManCiNum(p) + Gia_ManAndNum(p) );

    // permute
    Gia_ManRandom(1);
    Gia_ManRandom(0);
    for ( i = 0; i < Vec_IntSize(vWeights); i++ )
    {
        j = (Gia_ManRandom(0) >> 1) % Vec_IntSize(vWeights);
        ABC_SWAP( int, vPivots->pArray[i], vPivots->pArray[j] );
        ABC_SWAP( int, vWeights->pArray[i], vWeights->pArray[j] );
    }
    // sort
    if ( SelectShift == 0 )
        pPerm = Abc_QuickSortCost( Vec_IntArray(vWeights), Vec_IntSize(vWeights), 1 );
    else
    {
        Vec_Int_t * vTemp = Vec_IntStartNatural( Vec_IntSize(vWeights) );
        pPerm = Vec_IntReleaseArray( vTemp );
        Vec_IntFree( vTemp );
    }

    // select    
    Limit = Abc_MinInt( 64, Vec_IntSize(vWeights) );
    vResult = Vec_IntAlloc( Limit );
    for ( i = 0; i < Limit; i++ )
    {
        j = (i + SelectShift) % Vec_IntSize(vWeights);
        if ( fVerbose )
            printf( "%2d : Pivot =%7d  Fanout =%7d\n", j, Vec_IntEntry(vPivots, pPerm[j]), Vec_IntEntry(vWeights, pPerm[j]) );
        Vec_IntPush( vResult, Vec_IntEntry(vPivots, pPerm[j]) );
    }

    Vec_IntFree( vPivots );
    Vec_IntFree( vWeights );
    ABC_FREE( pPerm );

    return vResult;
}